

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

unique_ptr<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>_>
pbrt::PathIntegrator::Create
          (ParameterDictionary *parameters,CameraHandle *camera,SamplerHandle *sampler,
          PrimitiveHandle *aggregate,
          vector<pbrt::LightHandle,_std::allocator<pbrt::LightHandle>_> *lights,FileLoc *loc)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_9e;
  allocator<char> local_9d;
  int maxDepth;
  string local_98;
  SamplerHandle *local_78;
  string lightStrategy;
  bool regularize;
  
  local_78 = sampler;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&lightStrategy,"maxdepth",(allocator<char> *)&local_98);
  iVar2 = ParameterDictionary::GetOneInt((ParameterDictionary *)camera,&lightStrategy,5);
  std::__cxx11::string::~string((string *)&lightStrategy);
  maxDepth = iVar2;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"lightsampler",&local_9e);
  std::__cxx11::string::string<std::allocator<char>>((string *)&regularize,"bvh",&local_9d);
  ParameterDictionary::GetOneString
            (&lightStrategy,(ParameterDictionary *)camera,&local_98,(string *)&regularize);
  std::__cxx11::string::~string((string *)&regularize);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"regularize",&local_9e);
  bVar1 = ParameterDictionary::GetOneBool((ParameterDictionary *)camera,&local_98,false);
  std::__cxx11::string::~string((string *)&local_98);
  regularize = bVar1;
  std::
  make_unique<pbrt::PathIntegrator,int&,pbrt::CameraHandle&,pbrt::SamplerHandle&,pbrt::PrimitiveHandle&,std::vector<pbrt::LightHandle,std::allocator<pbrt::LightHandle>>&,std::__cxx11::string&,bool&>
            ((int *)parameters,(CameraHandle *)&maxDepth,local_78,aggregate,lights,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)loc,
             (bool *)&lightStrategy);
  std::__cxx11::string::~string((string *)&lightStrategy);
  return (__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
          )(__uniq_ptr_data<pbrt::PathIntegrator,_std::default_delete<pbrt::PathIntegrator>,_true,_true>
            )parameters;
}

Assistant:

std::unique_ptr<PathIntegrator> PathIntegrator::Create(
    const ParameterDictionary &parameters, CameraHandle camera, SamplerHandle sampler,
    PrimitiveHandle aggregate, std::vector<LightHandle> lights, const FileLoc *loc) {
    int maxDepth = parameters.GetOneInt("maxdepth", 5);
    std::string lightStrategy = parameters.GetOneString("lightsampler", "bvh");
    bool regularize = parameters.GetOneBool("regularize", false);
    return std::make_unique<PathIntegrator>(maxDepth, camera, sampler, aggregate, lights,
                                            lightStrategy, regularize);
}